

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTextureOffset.cpp
# Opt level: O1

GMM_GFX_SIZE_T __thiscall
GmmLib::GmmTextureCalc::Get3DMipByteAddress
          (GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,GMM_REQ_OFFSET_INFO *pReqInfo)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint32_t local_74;
  ulong uStack_70;
  uint32_t CompressDepth;
  long local_68;
  ulong local_60;
  GmmTextureCalc *local_58;
  GMM_TEXTURE_INFO *local_50;
  uint local_44;
  uint local_40;
  uint32_t CompressHeight;
  uint32_t CompressWidth;
  uint8_t local_31;
  
  if (this->pGmmLibContext == (Context *)0x0) {
    return 0;
  }
  uVar3 = pReqInfo->MipLevel;
  CompressHeight = pReqInfo->Slice;
  if (CompressHeight != 0) {
    local_60 = (ulong)(uint)pTexInfo->Pitch;
    local_68 = *(long *)(pTexInfo->MmcHint + (ulong)uVar3 * 8 + 0x78);
    bVar1 = (byte)uVar3;
    uStack_70 = 1L << (bVar1 & 0x3f);
    CompressWidth = (uint32_t)((ulong)CompressHeight / (uStack_70 & 0xffffffff));
    uVar5 = (uint)pTexInfo->BaseWidth >> (bVar1 & 0x1f);
    uVar2 = pTexInfo->BaseHeight >> (bVar1 & 0x1f);
    uVar3 = (pTexInfo->Alignment).HAlign;
    uVar4 = (pTexInfo->Alignment).VAlign;
    local_58 = this;
    local_31 = GmmIsCompressed(this->pGmmLibContext,pTexInfo->Format);
    local_50 = pTexInfo;
    GetCompressionBlockDimensions(local_58,pTexInfo->Format,&local_40,&local_44,&local_74);
    if (uVar2 <= uVar4) {
      uVar2 = uVar4;
    }
    uVar4 = -uVar4 & (uVar4 - 1) + uVar2;
    if (uVar5 <= uVar3) {
      uVar5 = uVar3;
    }
    uVar3 = -uVar3 & (uVar3 - 1) + uVar5;
    if (local_31 == '\0') {
      if (((local_50->Flags).Gpu.field_0x3 & 0x20) != 0) {
        uVar3 = uVar3 * 2;
        uVar4 = uVar4 >> 1;
      }
    }
    else {
      uVar3 = uVar3 / local_40;
      uVar4 = uVar4 / local_44;
    }
    return ((ulong)local_50->BitsPerPixel * (ulong)((int)uStack_70 - 1U & CompressHeight) *
            (ulong)uVar3 >> 3) + (ulong)uVar4 * local_60 * CompressWidth + local_68;
  }
  return *(GMM_GFX_SIZE_T *)(pTexInfo->MmcHint + (ulong)uVar3 * 8 + 0x78);
}

Assistant:

GMM_GFX_SIZE_T GmmLib::GmmTextureCalc::Get3DMipByteAddress(GMM_TEXTURE_INFO *   pTexInfo,
                                                           GMM_REQ_OFFSET_INFO *pReqInfo)
{
    uint32_t            MipsInThisRow, PlaneRows;
    uint32_t            MipHeight, MipWidth;
    uint32_t            UnitAlignHeight, UnitAlignWidth;
    GMM_GFX_SIZE_T      MipMapByteAddress, ExtraBytes;
    uint32_t            Slice, MipLevel, Pitch;
    uint8_t             Compress;
    GMM_RESOURCE_FORMAT GenericFormat;
    uint32_t            CompressHeight, CompressWidth, CompressDepth;

    __GMM_ASSERTPTR(pGmmLibContext, 0);

    GenericFormat = pTexInfo->Format;
    Slice         = pReqInfo->Slice;
    MipLevel      = pReqInfo->MipLevel;
    Pitch         = GFX_ULONG_CAST(pTexInfo->Pitch);

    // For slice 0 for any mip address is simple and stored in table
    if(Slice == 0)
    {
        MipMapByteAddress = pTexInfo->OffsetInfo.Texture3DOffsetInfo.Offset[MipLevel];
    }
    // For any slice
    else
    {
        MipMapByteAddress = pTexInfo->OffsetInfo.Texture3DOffsetInfo.Offset[MipLevel];

        // See how many mip can fit in one row
        MipsInThisRow = GFX_2_TO_POWER_OF(MipLevel);

        PlaneRows = Slice / MipsInThisRow;

        // make sure we get the height and mip of base level
        MipWidth  = GFX_ULONG_CAST(pTexInfo->BaseWidth);
        MipHeight = pTexInfo->BaseHeight;

        MipWidth >>= MipLevel;
        MipHeight >>= MipLevel;

        UnitAlignWidth  = pTexInfo->Alignment.HAlign;
        UnitAlignHeight = pTexInfo->Alignment.VAlign;
        Compress        = GmmIsCompressed(pGmmLibContext, pTexInfo->Format);
        GetCompressionBlockDimensions(pTexInfo->Format, &CompressWidth, &CompressHeight, &CompressDepth);

        // clamp such that mip height is at least min height
        MipHeight = GFX_MAX(MipHeight, UnitAlignHeight);
        MipHeight = GFX_ALIGN(MipHeight, UnitAlignHeight);

        // clamp such that mip width is at least min width
        MipWidth = GFX_MAX(MipWidth, UnitAlignWidth);
        MipWidth = GFX_ALIGN(MipWidth, UnitAlignWidth);

        if(Compress)
        {
            MipWidth /= CompressWidth;
            MipHeight /= CompressHeight;
        }
        else if(pTexInfo->Flags.Gpu.SeparateStencil)
        {
            MipWidth *= 2;
            MipHeight /= 2;
        }

        ExtraBytes = (GMM_GFX_SIZE_T)PlaneRows * MipHeight * Pitch;

        ExtraBytes += ((GMM_GFX_SIZE_T)(Slice % MipsInThisRow) *
                       MipWidth * pTexInfo->BitsPerPixel) >>
                      3;

        // get address offset
        MipMapByteAddress += ExtraBytes;
    }

    return MipMapByteAddress;
}